

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::ensureLayouted(QTextDocumentLayoutPrivate *this,QFixed y)

{
  if (this->currentLazyLayoutPosition != -1) {
    QTextDocumentLayout::dynamicDocumentSize
              (*(QTextDocumentLayout **)&(this->super_QAbstractTextDocumentLayoutPrivate).field_0x8)
    ;
    if ((this->checkPoints).d.size != 0) goto LAB_00479681;
    do {
      layoutStep(this);
LAB_00479681:
    } while ((this->currentLazyLayoutPosition != -1) &&
            ((this->checkPoints).d.ptr[(this->checkPoints).d.size + -1].y.val < y.val));
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::ensureLayouted(QFixed y) const
{
    Q_Q(const QTextDocumentLayout);
    if (currentLazyLayoutPosition == -1)
        return;
    const QSizeF oldSize = q->dynamicDocumentSize();
    Q_UNUSED(oldSize);

    if (checkPoints.isEmpty())
        layoutStep();

    while (currentLazyLayoutPosition != -1
           && checkPoints.last().y < y)
        layoutStep();
}